

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,char **text,char *defaultValue)

{
  Node *this_00;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  this_00 = this->node;
  uVar1 = Node::getEntry(this_00,key);
  if (((int)uVar1 < 0) || (pcVar3 = this_00->entry_[uVar1].value, pcVar3 == (char *)0x0)) {
    pcVar3 = defaultValue;
    if (defaultValue == (char *)0x0) {
      pcVar3 = (char *)0x0;
      pcVar2 = (char *)0x0;
      goto LAB_001c5063;
    }
  }
  else {
    pcVar2 = strchr(pcVar3,0x5c);
    if (pcVar2 != (char *)0x0) {
      pcVar3 = decodeText(pcVar3);
      *text = pcVar3;
      return '\x01';
    }
  }
  pcVar2 = strdup(pcVar3);
LAB_001c5063:
  *text = pcVar2;
  return pcVar3 != defaultValue;
}

Assistant:

char Fl_Preferences::get( const char *key, char *&text, const char *defaultValue ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    text = decodeText( v );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v )
    text = strdup( v );
  else
    text = 0;
  return ( v != defaultValue );
}